

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::printScope(TypePrinter *this,Scope *scope)

{
  pointer this_00;
  long in_RDI;
  FormatBuffer *in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffb8;
  Scope *in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    this_00 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
              operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                          *)0x9ff70e);
    getLexicalPath_abi_cxx11_(in_stack_ffffffffffffffd8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    FormatBuffer::append(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  }
  return;
}

Assistant:

void TypePrinter::printScope(const Scope* scope) {
    if (options.elideScopeNames)
        return;

    buffer->append(getLexicalPath(scope));
}